

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

String * asl::Process::loadedLibPath(String *__return_storage_ptr__,String *lib)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  String *pSVar4;
  int local_cc;
  undefined1 local_c8 [4];
  int i;
  Array<asl::String> parts;
  char *s;
  String line;
  undefined1 local_78 [8];
  String name2;
  String local_50;
  undefined1 local_38 [8];
  String name1;
  FILE *mapfile;
  String *lib_local;
  
  name1.field_2._8_8_ = fopen("/proc/self/maps","rt");
  if ((FILE *)name1.field_2._8_8_ == (FILE *)0x0) {
    name1.field_2._8_8_ = fopen("/proc/curproc/map","rt");
  }
  if (name1.field_2._8_8_ == 0) {
    asl::String::String(__return_storage_ptr__,"");
  }
  else {
    operator+(&local_50,'/',lib);
    asl::String::operator+((String *)local_38,&local_50,".so");
    asl::String::~String(&local_50);
    operator+((String *)((long)&line.field_2 + 8),"/lib",lib);
    asl::String::operator+((String *)local_78,(String *)((long)&line.field_2 + 8),".so");
    asl::String::~String((String *)((long)&line.field_2 + 8));
    asl::String::String((String *)&s,1000,1000);
    do {
      iVar2 = feof((FILE *)name1.field_2._8_8_);
      if (iVar2 != 0) {
LAB_00169ee0:
        fclose((FILE *)name1.field_2._8_8_);
        asl::String::String(__return_storage_ptr__,"");
        break;
      }
      SafeString::SafeString((SafeString *)&parts,(String *)&s);
      pcVar3 = SafeString::operator_cast_to_char_((SafeString *)&parts);
      pcVar3 = fgets(pcVar3,1000,name1.field_2._8_8_);
      SafeString::~SafeString((SafeString *)&parts);
      if (pcVar3 == (char *)0x0) goto LAB_00169ee0;
      asl::String::split((String *)local_c8);
      for (local_cc = 0; iVar2 = Array<asl::String>::length((Array<asl::String> *)local_c8),
          local_cc < iVar2; local_cc = local_cc + 1) {
        pSVar4 = Array<asl::String>::operator[]((Array<asl::String> *)local_c8,local_cc);
        bVar1 = asl::String::contains(pSVar4,(String *)local_38);
        if (bVar1) {
LAB_00169e3f:
          fclose((FILE *)name1.field_2._8_8_);
          pSVar4 = Array<asl::String>::operator[]((Array<asl::String> *)local_c8,local_cc);
          asl::String::String(__return_storage_ptr__,pSVar4);
          bVar1 = true;
          goto LAB_00169ec3;
        }
        pSVar4 = Array<asl::String>::operator[]((Array<asl::String> *)local_c8,local_cc);
        bVar1 = asl::String::contains(pSVar4,(String *)local_78);
        if (bVar1) goto LAB_00169e3f;
      }
      bVar1 = false;
LAB_00169ec3:
      Array<asl::String>::~Array((Array<asl::String> *)local_c8);
    } while (!bVar1);
    asl::String::~String((String *)&s);
    asl::String::~String((String *)local_78);
    asl::String::~String((String *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

String Process::loadedLibPath(const String& lib)
{
	//TextFile mapfile("/proc/self/maps", File::READ);
	FILE* mapfile = fopen("/proc/self/maps", "rt"); // linux
	if(!mapfile)
		mapfile = fopen("/proc/curproc/map", "rt"); // freebsd
	if(!mapfile)
		return "";
	
	String name1 = '/' + lib + ".so";
	String name2 = "/lib" + lib + ".so";
	String line(1000, 1000);

	while(!feof(mapfile))
	{
		//String line = mapfile.readLine();
		char* s = fgets(SafeString(line), 1000, mapfile);
		if(!s) break;
		Array<String> parts = line.split();
		for(int i=0; i<parts.length(); i++)
		if(parts[i].contains(name1) || parts[i].contains(name2))
		{
			fclose(mapfile);
			return parts[i];
		}
	}
	fclose(mapfile);
	return "";
}